

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O3

void __thiscall
Js::JavascriptExternalFunction::JavascriptExternalFunction
          (JavascriptExternalFunction *this,JavascriptExternalFunction *entryPoint,DynamicType *type
          )

{
  RuntimeFunction::RuntimeFunction
            (&this->super_RuntimeFunction,type,(FunctionInfo *)EntryInfo::WrappedFunctionThunk);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014fab68;
  this->flags = 0;
  (this->signature).ptr = (void *)0x0;
  (this->callbackState).ptr = (void *)0x0;
  Memory::Recycler::WBSetBit((char *)&this->field_3);
  (this->field_3).nativeMethod = (Type)entryPoint;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_3);
  (this->initMethod).ptr = (_func_int_void_ptr *)0x0;
  *(uint *)&this->field_0x68 = (*(uint *)&this->field_0x68 & 0xfe0000) + 1;
  JavascriptFunction::VerifyEntryPoint((JavascriptFunction *)this);
  return;
}

Assistant:

JavascriptExternalFunction::JavascriptExternalFunction(JavascriptExternalFunction* entryPoint, DynamicType* type)
        : RuntimeFunction(type, &EntryInfo::WrappedFunctionThunk), wrappedMethod(entryPoint), callbackState(nullptr), initMethod(nullptr),
        oneBit(1), typeSlots(0), hasAccessors(0), flags(0), deferredLength(0)
    {
        DebugOnly(VerifyEntryPoint());
    }